

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_ObjCollectTfo_rec(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int i;
  Acb_ObjType_t AVar2;
  Vec_Int_t *pVVar3;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if ((iVar1 == 0) && ((fTerm != 0 || (iVar1 = Acb_ObjIsCo(p,iObj), iVar1 == 0)))) {
    for (iVar1 = 0; pVVar3 = Vec_WecEntry(&p->vFanouts,iObj), iVar1 < pVVar3->nSize;
        iVar1 = iVar1 + 1) {
      pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
      i = Vec_IntEntry(pVVar3,iVar1);
      AVar2 = Acb_ObjType(p,i);
      if (AVar2 != ABC_OPER_NONE) {
        Acb_ObjCollectTfo_rec(p,i,fTerm);
      }
    }
    Vec_IntPush(&p->vArray1,iObj);
    return;
  }
  return;
}

Assistant:

void Acb_ObjCollectTfo_rec( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( !fTerm && Acb_ObjIsCo(p, iObj) )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjCollectTfo_rec( p, iFanout, fTerm );
    Vec_IntPush( &p->vArray1, iObj );
}